

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexpr.h
# Opt level: O3

SExpr * SExprParseValue(SExprParser *parser)

{
  int *piVar1;
  char cVar2;
  size_t sVar3;
  SExprPool *pSVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  char *pcVar9;
  SExpr *pSVar10;
  anon_union_8_5_1f899604_for_SExpr_2 *paVar11;
  long lVar12;
  int iVar13;
  long lVar14;
  ulong uVar15;
  SExpr *pSVar16;
  int iVar17;
  SExpr *pSVar18;
  ulong uVar19;
  bool bVar20;
  bool bVar21;
  double dVar22;
  char buf [32];
  char local_58 [40];
  
  iVar17 = parser->last;
  while( true ) {
    if (iVar17 == 0) goto LAB_0010c252;
    iVar6 = isspace(iVar17);
    if (iVar6 == 0) break;
    if (iVar17 == 10) {
      parser->lineNumber = parser->lineNumber + 1;
    }
    iVar17 = parser->pos;
    if (parser->len <= (ulong)(long)iVar17) {
      parser->last = 0;
      goto LAB_0010c252;
    }
    parser->pos = iVar17 + 1;
    iVar17 = (int)parser->src[iVar17];
    parser->last = iVar17;
  }
  iVar6 = isalpha(iVar17);
  if (iVar6 == 0) {
    if (iVar17 - 0x30U < 10) {
LAB_0010c34f:
      lVar12 = 0;
      bVar20 = false;
      while( true ) {
        if (((9 < iVar17 - 0x30U) && (iVar17 != 0x2d)) && (!(bool)(iVar17 == 0x2e & (bVar20 ^ 1U))))
        {
          local_58[lVar12] = '\0';
          pSVar4 = parser->pool;
          sVar3 = parser->poolUsed;
          if (!bVar20) {
            if (pSVar4 == (SExprPool *)0x0) {
              pSVar18 = &SExprAlloc::dummy;
            }
            else {
              pSVar18 = pSVar4->data + sVar3;
              pSVar18->type = SE_INT;
              pSVar18->next = (SExpr *)0x0;
            }
            parser->poolUsed = sVar3 + 1;
            lVar12 = strtol(local_58,(char **)0x0,10);
            (pSVar18->field_2).i = (int)lVar12;
            return pSVar18;
          }
          if (pSVar4 == (SExprPool *)0x0) {
            pSVar18 = &SExprAlloc::dummy;
          }
          else {
            pSVar18 = pSVar4->data + sVar3;
            pSVar18->type = SE_FLOAT;
            pSVar18->next = (SExpr *)0x0;
          }
          parser->poolUsed = sVar3 + 1;
          dVar22 = strtod(local_58,(char **)0x0);
          (pSVar18->field_2).f = (float)dVar22;
          return pSVar18;
        }
        if (lVar12 == 0x1f) break;
        bVar21 = iVar17 == 0x2e;
        local_58[lVar12] = (char)iVar17;
        iVar6 = parser->pos;
        iVar17 = 0;
        if ((ulong)(long)iVar6 < parser->len) {
          parser->pos = iVar6 + 1;
          iVar17 = (int)parser->src[iVar6];
        }
        bVar20 = (bool)(bVar20 | bVar21);
        parser->last = iVar17;
        lVar12 = lVar12 + 1;
      }
      (parser->result).type = SE_SYNTAX_ERROR;
      pcVar9 = "Numeric literal is too long.";
      goto LAB_0010c260;
    }
    if (iVar17 < 0x2d) {
      if (iVar17 == 0x22) {
        sVar3 = parser->poolUsed;
        if (parser->pool == (SExprPool *)0x0) {
          pSVar18 = &SExprAlloc::dummy;
        }
        else {
          pSVar18 = parser->pool->data + sVar3;
          pSVar18->type = SE_STRING;
          pSVar18->next = (SExpr *)0x0;
        }
        parser->poolUsed = sVar3 + 1;
        (pSVar18->field_2).s.len = 0;
        iVar17 = parser->pos;
        (pSVar18->field_2).i = iVar17;
        while( true ) {
          uVar15 = (ulong)iVar17;
          iVar6 = 0;
          if (uVar15 < parser->len) {
            iVar17 = iVar17 + 1;
            parser->pos = iVar17;
            iVar6 = (int)parser->src[uVar15];
          }
          parser->last = iVar6;
          if (iVar6 == 0) break;
          if (iVar6 == 0x22) {
            iVar6 = 0;
            if ((ulong)(long)iVar17 < parser->len) {
              parser->pos = iVar17 + 1;
              iVar6 = (int)parser->src[iVar17];
            }
            parser->last = iVar6;
            return pSVar18;
          }
          piVar1 = &(pSVar18->field_2).s.len;
          *piVar1 = *piVar1 + 1;
          iVar17 = parser->pos;
        }
        (parser->result).type = SE_SYNTAX_ERROR;
        pcVar9 = "Unexpected EOF when expecting end of string.";
        goto LAB_0010c260;
      }
      if (iVar17 != 0x28) goto LAB_0010c51a;
    }
    else if ((iVar17 != 0x7b) && (iVar17 != 0x5b)) {
      if (((iVar17 == 0x2d) && ((ulong)(long)parser->pos < parser->len)) &&
         ((int)parser->src[parser->pos] - 0x30U < 10)) goto LAB_0010c34f;
LAB_0010c51a:
      (parser->result).type = SE_SYNTAX_ERROR;
      pcVar9 = "Unexpected character";
      goto LAB_0010c260;
    }
    iVar17 = parser->pos;
    uVar15 = parser->len;
    if (uVar15 <= (ulong)(long)iVar17) goto LAB_0010c500;
    parser->pos = iVar17 + 1;
    cVar2 = parser->src[iVar17];
    iVar6 = (int)cVar2;
    parser->last = iVar6;
    if (cVar2 == '\0') goto LAB_0010c507;
    uVar19 = (ulong)(iVar17 + 1);
    iVar17 = iVar17 + 2;
    goto LAB_0010c47b;
  }
  iVar6 = parser->pos;
  uVar19 = (ulong)(iVar6 - 1);
  uVar15 = 0;
  iVar13 = iVar6;
  while ((iVar7 = isalnum(iVar17), iVar7 != 0 ||
         ((iVar17 - 0x24U < 0x3c &&
          ((0x80000000a000ac1U >> ((ulong)(iVar17 - 0x24U) & 0x3f) & 1) != 0))))) {
    uVar8 = (ulong)iVar13;
    iVar17 = 0;
    if (uVar8 < parser->len) {
      iVar13 = iVar13 + 1;
      parser->pos = iVar13;
      iVar17 = (int)parser->src[uVar8];
    }
    parser->last = iVar17;
    uVar15 = uVar15 + 1;
    uVar19 = uVar19 + 0x100000000;
  }
  if ((int)uVar15 == 0) {
LAB_0010c3b6:
    SExprParseValue::strue.field_2.b = true;
    return &SExprParseValue::strue;
  }
  pcVar9 = parser->src;
  lVar12 = uVar15 - 1;
  if (pcVar9[(long)iVar6 + -1] == 't') {
    lVar5 = 0;
    do {
      lVar14 = lVar5;
      if ((lVar12 == lVar14) || (lVar14 == 3)) break;
      lVar5 = lVar14 + 1;
    } while (pcVar9[iVar6 + (int)lVar14] == "true"[lVar14 + 1]);
    if (uVar15 <= lVar14 + 1U) goto LAB_0010c3b6;
  }
  if (pcVar9[(long)iVar6 + -1] == 'f') {
    lVar5 = 0;
    do {
      lVar14 = lVar5;
      bVar20 = lVar12 == 0;
      lVar12 = lVar12 + -1;
      if ((bVar20) || (lVar14 == 4)) break;
      lVar5 = lVar14 + 1;
    } while (pcVar9[iVar6 + (int)lVar14] == "false"[lVar14 + 1]);
    if (uVar15 <= lVar14 + 1U) {
      SExprParseValue::sfalse.field_2.b = false;
      return &SExprParseValue::sfalse;
    }
  }
  sVar3 = parser->poolUsed;
  if (parser->pool == (SExprPool *)0x0) {
    pSVar18 = &SExprAlloc::dummy;
  }
  else {
    pSVar18 = parser->pool->data + sVar3;
    pSVar18->type = SE_ID;
    pSVar18->next = (SExpr *)0x0;
  }
  parser->poolUsed = sVar3 + 1;
  *(ulong *)&(pSVar18->field_2).b = uVar19;
  return pSVar18;
LAB_0010c6e5:
  if (iVar6 < 0x5d) {
    if (iVar6 == 0) {
      (parser->result).type = SE_SYNTAX_ERROR;
      pcVar9 = "Unexpected EOF when expecting end of list.";
      goto LAB_0010c260;
    }
    if (iVar6 == 0x29) goto LAB_0010c787;
  }
  else if ((iVar6 == 0x5d) || (iVar6 == 0x7d)) {
LAB_0010c787:
    iVar17 = parser->pos;
    iVar6 = 0;
    if ((ulong)(long)iVar17 < parser->len) {
      parser->pos = iVar17 + 1;
      iVar6 = (int)parser->src[iVar17];
    }
    parser->last = iVar6;
    return pSVar18;
  }
  pSVar10 = SExprParseValue(parser);
  if (pSVar10 == (SExpr *)0x0) {
    return (SExpr *)0x0;
  }
  paVar11 = (anon_union_8_5_1f899604_for_SExpr_2 *)&pSVar16->next;
  if (pSVar16 == (SExpr *)0x0) {
    paVar11 = &pSVar18->field_2;
  }
  paVar11->head = pSVar10;
  iVar17 = parser->last;
  iVar13 = 0;
  pSVar16 = pSVar10;
  iVar6 = iVar13;
  if (iVar17 != 0) {
    do {
      iVar7 = isspace(iVar17);
      iVar6 = iVar17;
      if (iVar7 == 0) break;
      if (iVar17 == 10) {
        parser->lineNumber = parser->lineNumber + 1;
      }
      iVar17 = parser->pos;
      if (parser->len <= (ulong)(long)iVar17) {
        parser->last = 0;
        iVar6 = iVar13;
        break;
      }
      parser->pos = iVar17 + 1;
      cVar2 = parser->src[iVar17];
      iVar17 = (int)cVar2;
      parser->last = iVar17;
      iVar6 = iVar13;
    } while (cVar2 != '\0');
  }
  goto LAB_0010c6e5;
LAB_0010c500:
  parser->last = 0;
  goto LAB_0010c507;
LAB_0010c252:
  (parser->result).type = SE_SYNTAX_ERROR;
  pcVar9 = "Unexpected EOF";
  goto LAB_0010c260;
  while( true ) {
    if (iVar6 == 10) {
      parser->lineNumber = parser->lineNumber + 1;
    }
    if (uVar15 <= uVar19) goto LAB_0010c500;
    parser->pos = iVar17;
    cVar2 = parser->src[uVar19];
    iVar6 = (int)cVar2;
    uVar19 = uVar19 + 1;
    iVar17 = iVar17 + 1;
    parser->last = iVar6;
    if (cVar2 == '\0') break;
LAB_0010c47b:
    iVar13 = isspace(iVar6);
    if (iVar13 == 0) {
      if (iVar6 < 0x5d) {
        if (iVar6 == 0) break;
        if (iVar6 == 0x29) {
LAB_0010c667:
          iVar6 = 0;
          if (uVar19 < uVar15) {
            parser->pos = iVar17;
            iVar6 = (int)parser->src[uVar19];
          }
          parser->last = iVar6;
          return &SExprParseValue::nil;
        }
      }
      else if ((iVar6 == 0x5d) || (iVar6 == 0x7d)) goto LAB_0010c667;
      pSVar4 = parser->pool;
      uVar15 = parser->poolUsed;
      if (pSVar4 == (SExprPool *)0x0) {
        parser->poolUsed = uVar15 + 1;
        pSVar18 = &SExprAlloc::dummy;
      }
      else if (uVar15 < pSVar4->count) {
        pSVar18 = pSVar4->data;
        parser->poolUsed = uVar15 + 1;
        pSVar18 = pSVar18 + uVar15;
        pSVar18->type = SE_LIST;
        pSVar18->next = (SExpr *)0x0;
      }
      else {
        (parser->result).type = SE_INSUFFICIENT_SPACE;
        pSVar18 = (SExpr *)0x0;
      }
      pSVar16 = (SExpr *)0x0;
      goto LAB_0010c6e5;
    }
  }
LAB_0010c507:
  (parser->result).type = SE_SYNTAX_ERROR;
  pcVar9 = "Unexpected EOF when expecting \')\' or list elements.";
LAB_0010c260:
  (parser->result).field_1.expr = (SExpr *)pcVar9;
  return (SExpr *)0x0;
}

Assistant:

SEXPR_DEF SExpr* SExprParseValue(SExprParser* parser)
{
    while(parser->last && isspace(parser->last)) {
        if(parser->last == '\n') {
            parser->lineNumber++;
        }

        parser->last = SExprGetChar(parser);
    }

    if(!parser->last) {
        parser->result.type = SE_SYNTAX_ERROR;
        parser->result.syntaxError.message = "Unexpected EOF";

        return NULL;
    }

    if(isalpha(parser->last)) {
        SExprString s;

        s.len = 0;
        s.start = parser->pos - 1;

        while(isalnum(parser->last) || parser->last == '-' ||
                parser->last == '+' || parser->last == '/' ||
                parser->last == '*' || parser->last == '$' ||
                parser->last == '?' || parser->last == '_' ||
                parser->last == '=') {
            s.len++;
            parser->last = SExprGetChar(parser);
        }

        if(SExprStringEqual(parser->src, &s, "true")) {
            static SExpr strue = {SE_BOOL};
            strue.b = true;

            return &strue;
        } else if(SExprStringEqual(parser->src, &s, "false")) {
            static SExpr sfalse = {SE_BOOL};
            sfalse.b = false;
            
            return &sfalse;
        }

        SExpr* expr = SExprAlloc(parser, SE_ID);
        expr->s = s;

        return expr;
    } else if(isdigit(parser->last) || (parser->last == '-' && isdigit(SExprPeek(parser)))) {
        int i = 0;
        char buf[32];

        bool isFloat = false;

        while(isdigit(parser->last) || (!isFloat && parser->last == '.') || parser->last == '-') {
            if(i >= sizeof(buf) - 1) {
                parser->result.type = SE_SYNTAX_ERROR;
                parser->result.syntaxError.message = "Numeric literal is too long.";
                return NULL;
            }

            if(parser->last == '.') {
                isFloat = true;
            }

            buf[i++] = parser->last;
            parser->last = SExprGetChar(parser);
        }

        buf[i] = '\0';

        if(isFloat) {
            SExpr* expr = SExprAlloc(parser, SE_FLOAT);
            expr->f = (float)strtod(buf, NULL);
            return expr;
        }    

        SExpr* expr = SExprAlloc(parser, SE_INT);
        expr->i = strtol(buf, NULL, 10);
        return expr;
    } else if(parser->last == '"') {
        SExpr* expr = SExprAlloc(parser, SE_STRING);

        expr->s.len = 0;
        expr->s.start = parser->pos;

        parser->last = SExprGetChar(parser);

        while(parser->last && parser->last != '"') {
            expr->s.len++;
            parser->last = SExprGetChar(parser);
        }

        if(!parser->last) {
            parser->result.type = SE_SYNTAX_ERROR;
            parser->result.syntaxError.message = "Unexpected EOF when expecting end of string.";
            return NULL;
        }

        parser->last = SExprGetChar(parser);

        return expr;
    } else if(parser->last == '(' || parser->last == '[' || parser->last == '{') {
        parser->last = SExprGetChar(parser);

        while(parser->last && isspace(parser->last)) {
			if(parser->last == '\n') {
				parser->lineNumber++;
			}
            parser->last = SExprGetChar(parser);
        }

        if(!parser->last) {
            parser->result.type = SE_SYNTAX_ERROR;
            parser->result.syntaxError.message = "Unexpected EOF when expecting ')' or list elements.";
            return NULL;
        }

        if(parser->last == ')' || parser->last == ']' || parser->last == '}') {
            parser->last = SExprGetChar(parser);
            
            static SExpr nil = {SE_NIL};
            return &nil;
        }

        SExpr* list = SExprAlloc(parser, SE_LIST);
        SExpr* tail = NULL;

        while(parser->last && parser->last != ')' && parser->last != ']' && parser->last != '}') {
            SExpr* elem = SExprParseValue(parser);

            if(!elem) {
                // There must have been an error
                return NULL;
            }

            if(!tail) {
                list->head = tail = elem;
            } else {
                tail->next = elem;
				tail = elem;
            }

			while(parser->last && isspace(parser->last)) {		
				if(parser->last == '\n') {
					parser->lineNumber++;
				}
				parser->last = SExprGetChar(parser);
			}
        }

        if(!parser->last) {
            parser->result.type = SE_SYNTAX_ERROR;
            parser->result.syntaxError.message = "Unexpected EOF when expecting end of list.";
            return NULL;
        }

        parser->last = SExprGetChar(parser);

        return list;
    }

    parser->result.type = SE_SYNTAX_ERROR;
    parser->result.syntaxError.message = "Unexpected character";
    return NULL;
}